

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

void __thiscall arangodb::velocypack::Parser::parseFalse(Parser *this)

{
  ValueLength *pVVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  Builder *this_00;
  ValueLength VVar5;
  Exception *this_01;
  
  uVar2 = this->_size;
  uVar3 = this->_pos;
  if (uVar3 < uVar2) {
    puVar4 = this->_start;
    this->_pos = uVar3 + 1;
    if ((puVar4[uVar3] == 'a') && (uVar3 + 1 < uVar2)) {
      this->_pos = uVar3 + 2;
      if ((puVar4[uVar3 + 1] == 'l') && (uVar3 + 2 < uVar2)) {
        this->_pos = uVar3 + 3;
        if ((puVar4[uVar3 + 2] == 's') && (uVar3 + 3 < uVar2)) {
          this->_pos = uVar3 + 4;
          if (puVar4[uVar3 + 3] == 'e') {
            this_00 = this->_builderPtr;
            Builder::reserve(this_00,1);
            VVar5 = this_00->_pos;
            this_00->_pos = VVar5 + 1;
            this_00->_start[VVar5] = '\x19';
            pVVar1 = &this_00->_bufferPtr->_size;
            *pVVar1 = *pVVar1 + 1;
            return;
          }
        }
      }
    }
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_01,ParseError,"Expecting \'false\'");
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline int consume() {
    if (_pos >= _size) {
      return -1;
    }
    return static_cast<int>(_start[_pos++]);
  }